

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parseSignedPackageInfoData(FfsParser *this,UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  USTATUS UVar2;
  uint offset;
  char *bytes;
  UByteArray local_140;
  UModelIndex *local_120;
  FfsParser *local_118;
  char *local_110;
  undefined8 local_108;
  char local_100 [16];
  UByteArray hash;
  UByteArray module;
  UByteArray body;
  CBString local_90;
  CBString info;
  CBString name;
  UModelIndex local_48;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    local_120 = index;
    local_118 = this;
    TreeModel::body(&body,this->model,index);
    offset = 0;
    while( true ) {
      if (((uint)body.d._M_string_length <= offset) ||
         ((uint)body.d._M_string_length - offset < 0x14)) break;
      bytes = body.d._M_dataplus._M_p + offset;
      UByteArray::UByteArray(&module,bytes,*(ushort *)(bytes + 0xe) + 0x14);
      usprintf(&name,"%.12s",bytes);
      UByteArray::UByteArray(&hash,bytes + 0x14,(uint)*(ushort *)(bytes + 0xe));
      std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                (hash.d._M_dataplus._M_p,hash.d._M_dataplus._M_p + hash.d._M_string_length);
      usprintf((CBString *)&local_140,
               "Full size: %Xh (%u)\nType: %Xh\nHash algorithm: %Xh\nHash size: %Xh (%u)\nMetadata size: %Xh (%u)\nMetadata hash: "
               ,(ulong)(uint)module.d._M_string_length,(ulong)(uint)module.d._M_string_length,
               (ulong)(byte)bytes[0xc],(ulong)(byte)bytes[0xd],(ulong)*(ushort *)(bytes + 0xe),
               (ulong)*(ushort *)(bytes + 0xe),(ulong)*(uint *)(bytes + 0x10),
               (ulong)*(uint *)(bytes + 0x10));
      UByteArray::toHex((UByteArray *)&local_110,&hash);
      Bstrlib::CBString::CBString(&local_90,local_110);
      Bstrlib::CBString::operator+(&info,(CBString *)&local_140,&local_90);
      Bstrlib::CBString::~CBString(&local_90);
      std::__cxx11::string::~string((string *)&local_110);
      Bstrlib::CBString::~CBString((CBString *)&local_140);
      this_00 = local_118->model;
      Bstrlib::CBString::CBString(&local_90);
      local_110 = local_100;
      local_108 = 0;
      local_100[0] = '\0';
      local_140.d._M_dataplus._M_p = (pointer)&local_140.d.field_2;
      local_140.d._M_string_length = 0;
      local_140.d.field_2._M_local_buf[0] = '\0';
      TreeModel::addItem(&local_48,this_00,offset,'c','\0',&name,&local_90,&info,
                         (UByteArray *)&local_110,&module,&local_140,Fixed,local_120,'\0');
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_110);
      Bstrlib::CBString::~CBString(&local_90);
      offset = offset + (uint)module.d._M_string_length;
      Bstrlib::CBString::~CBString(&info);
      std::__cxx11::string::~string((string *)&hash);
      Bstrlib::CBString::~CBString(&name);
      std::__cxx11::string::~string((string *)&module);
    }
    std::__cxx11::string::~string((string *)&body);
    UVar2 = 0;
  }
  else {
    UVar2 = 1;
  }
  return UVar2;
}

Assistant:

USTATUS FfsParser::parseSignedPackageInfoData(const UModelIndex & index)
{
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    UByteArray body = model->body(index);
    UINT32 offset = 0;
    while (offset < (UINT32)body.size()) {
        const CPD_EXT_SIGNED_PACKAGE_INFO_MODULE* moduleHeader = (const CPD_EXT_SIGNED_PACKAGE_INFO_MODULE*)(body.constData() + offset);
        if (sizeof(CPD_EXT_SIGNED_PACKAGE_INFO_MODULE) <= ((UINT32)body.size() - offset)) {
            // TODO: check sanity of moduleHeader->HashSize
            UByteArray module((const char*)moduleHeader, CpdExtSignedPkgMetadataHashOffset + moduleHeader->HashSize);
            UString name = usprintf("%.12s", moduleHeader->Name);
            
            // This hash is stored reversed
            // Need to reverse it back to normal
            UByteArray hash((const char*)moduleHeader + CpdExtSignedPkgMetadataHashOffset, moduleHeader->HashSize);
            std::reverse(hash.begin(), hash.end());
            
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh\nHash algorithm: %Xh\nHash size: %Xh (%u)\nMetadata size: %Xh (%u)\nMetadata hash: ",
                                    (UINT32)module.size(), (UINT32)module.size(),
                                    moduleHeader->Type,
                                    moduleHeader->HashAlgorithm,
                                    moduleHeader->HashSize, moduleHeader->HashSize,
                                    moduleHeader->MetadataSize, moduleHeader->MetadataSize) + UString(hash.toHex().constData());
            // Add tree otem
            model->addItem(offset, Types::CpdSpiEntry, 0, name, UString(), info, UByteArray(), module, UByteArray(), Fixed, index);
            offset += module.size();
        }
        else break;
        // TODO: add padding at the end
    }
    
    return U_SUCCESS;
}